

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::jp_cc_nn(GB *this,u8 mask,u8 val)

{
  long lVar1;
  u8 uVar2;
  bool bVar3;
  u8 val_local;
  u8 mask_local;
  GB *this_local;
  
  lVar1 = (this->s).op_tick;
  if (lVar1 == 0xe) {
    uVar2 = read_n(this);
    (this->s).field_6.field_0.z = uVar2;
  }
  else if (lVar1 == 0x16) {
    uVar2 = read_n(this);
    (this->s).field_6.field_0.w = uVar2;
    bVar3 = f_is(this,mask,val);
    if (bVar3) {
      (this->s).pc = (u16)(this->s).field_6;
    }
  }
  else if (lVar1 == 0x1e) {
    op_done(this);
  }
  return;
}

Assistant:

void GB::jp_cc_nn(u8 mask, u8 val) {
  switch (s.op_tick) {
    case 14: s.z = read_n(); break;
    case 22: s.w = read_n(); if (f_is(mask, val)) { s.pc = s.wz; } break;
    case 30: op_done(); break;
  }
}